

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

void __thiscall ftxui::Color::Color(Color *this,uint8_t red,uint8_t green,uint8_t blue)

{
  Color CVar1;
  int iVar2;
  ColorInfo CVar3;
  uint8_t uStack_47;
  int dist;
  int db;
  int dg;
  int dr;
  ColorInfo color_info;
  int i;
  int best;
  int closest;
  uint8_t blue_local;
  uint8_t green_local;
  uint8_t red_local;
  Color *this_local;
  
  this->type_ = TrueColor;
  (this->field_1).index_ = red;
  this->green_ = green;
  this->blue_ = blue;
  CVar1 = Terminal::ColorSupport();
  if (CVar1 != TrueColor) {
    i = 0x30000;
    color_info.blue = '\0';
    color_info.hue = '\0';
    color_info.saturation = '\0';
    color_info.value = '\0';
    color_info.index_256 = '\x10';
    color_info.index_16 = '\0';
    color_info.red = '\0';
    color_info.green = '\0';
    for (; (int)color_info._8_4_ < 0x100; color_info._8_4_ = color_info._8_4_ + 1) {
      CVar3 = GetColorInfo(color_info.index_256);
      color_info.name._2_1_ = CVar3.red;
      color_info.name._3_1_ = CVar3.green;
      color_info.name._4_1_ = CVar3.blue;
      iVar2 = ((uint)color_info.name._2_1_ - (uint)red) * ((uint)color_info.name._2_1_ - (uint)red)
              + ((uint)color_info.name._3_1_ - (uint)green) *
                ((uint)color_info.name._3_1_ - (uint)green) +
              ((uint)color_info.name._4_1_ - (uint)blue) *
              ((uint)color_info.name._4_1_ - (uint)blue);
      if (iVar2 < i) {
        color_info.blue = color_info.index_256;
        color_info.hue = color_info.index_16;
        color_info.saturation = color_info.red;
        color_info.value = color_info.green;
        i = iVar2;
      }
    }
    CVar1 = Terminal::ColorSupport();
    if (CVar1 == Palette256) {
      this->type_ = Palette256;
      (this->field_1).index_ = color_info.blue;
    }
    else {
      this->type_ = Palette16;
      CVar3 = GetColorInfo(color_info.blue);
      uStack_47 = CVar3.index_16;
      (this->field_1).index_ = uStack_47;
    }
  }
  return;
}

Assistant:

Color::Color(uint8_t red, uint8_t green, uint8_t blue)
    : type_(ColorType::TrueColor), red_(red), green_(green), blue_(blue) {
  if (Terminal::ColorSupport() == Terminal::Color::TrueColor)
    return;

  int closest = 256 * 256 * 3;
  int best = 0;
  for (int i = 16; i < 256; ++i) {
    ColorInfo color_info = GetColorInfo(Color::Palette256(i));
    int dr = color_info.red - red;
    int dg = color_info.green - green;
    int db = color_info.blue - blue;
    int dist = dr * dr + dg * dg + db * db;
    if (closest > dist) {
      closest = dist;
      best = i;
    }
  }

  if (Terminal::ColorSupport() == Terminal::Color::Palette256) {
    type_ = ColorType::Palette256;
    index_ = best;
  } else {
    type_ = ColorType::Palette16;
    index_ = GetColorInfo(Color::Palette256(best)).index_16;
  }
}